

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O1

int cvBuildNordsieckArrayAdams
              (sunrealtype *t,N_Vector y,N_Vector *f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  ulong uVar1;
  N_Vector *pp_Var2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int i;
  ulong uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  auVar11._0_4_ = -(uint)(t == (sunrealtype *)0x0);
  auVar11._4_4_ = -(uint)(y == (N_Vector)0x0);
  auVar11._8_4_ = -(uint)(f == (N_Vector *)0x0);
  auVar11._12_4_ = -(uint)(wrk == (N_Vector *)0x0);
  iVar6 = movmskps((int)t,auVar11);
  iVar7 = -0x16;
  if (((zn != (N_Vector *)0x0 && 0 < order) && iVar6 == 0) && (*f != (N_Vector)0x0)) {
    uVar5 = (ulong)(uint)order;
    bVar3 = true;
    uVar4 = 1;
    do {
      if (wrk[uVar4 - 1] == (N_Vector)0x0) break;
      if (uVar5 == uVar4) goto LAB_00118aa4;
      bVar3 = uVar4 < uVar5;
      pp_Var2 = f + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pp_Var2 != (N_Vector)0x0);
    if (!bVar3) {
LAB_00118aa4:
      if (1 < order) {
        uVar4 = 0;
        do {
          N_VScale(0x3ff0000000000000,f[uVar4],wrk[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        uVar8 = 1;
        uVar4 = uVar5;
        do {
          do {
            uVar1 = uVar4 - 1;
            dVar10 = 1.0 / (t[uVar1 - uVar8] - t[uVar4 - 1]);
            N_VLinearSum(dVar10,-dVar10,wrk[uVar4 - 2],wrk[uVar4 - 1]);
            uVar4 = uVar1;
          } while ((long)uVar8 < (long)uVar1);
          uVar8 = uVar8 + 1;
          uVar4 = uVar5;
        } while (uVar8 != uVar5);
        uVar5 = (ulong)(order - 1);
        N_VScale(0x3ff0000000000000,wrk[uVar5],zn[1]);
        uVar4 = 2;
        if (2 < order) {
          uVar4 = (ulong)(uint)order;
        }
        lVar9 = 0;
        do {
          N_VConst(0,zn[lVar9 + 2]);
          lVar9 = lVar9 + 1;
        } while (uVar4 - 1 != lVar9);
        lVar9 = uVar5 + 1;
        uVar4 = uVar5;
        uVar8 = (ulong)(order - 2);
        do {
          do {
            N_VLinearSum(*t - t[uVar8],(double)(int)uVar4,zn[lVar9],zn[lVar9 + -1],zn[lVar9]);
            lVar9 = lVar9 + -1;
            uVar4 = (ulong)((int)uVar4 - 1);
          } while (1 < (int)lVar9);
          N_VLinearSum(*t - t[uVar8],0x3ff0000000000000,zn[1],wrk[uVar8],zn[1]);
          iVar6 = (int)uVar8;
          lVar9 = uVar5 + 1;
          uVar4 = uVar5;
          uVar8 = uVar8 - 1;
        } while (0 < iVar6);
      }
      N_VScale(0x3ff0000000000000,y,*zn);
      N_VScale(0x3ff0000000000000,*f,zn[1]);
      iVar7 = 0;
      if (0 < order) {
        uVar4 = 1;
        do {
          N_VScale(zn[uVar4],zn[uVar4]);
          uVar4 = uVar4 + 1;
        } while (order + 1 != uVar4);
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

static int cvBuildNordsieckArrayAdams(sunrealtype* t, N_Vector y, N_Vector* f,
                                      N_Vector* wrk, int order,
                                      sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!f[i]) { return CV_ILL_INPUT; }
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Compute Newton polynomial coefficients interpolating f history */
    for (int i = 0; i < order; i++) { N_VScale(ONE, f[i], wrk[i]); }

    for (int i = 1; i < order; i++)
    {
      for (int j = order - 1; j >= i; j--)
      {
        /* Divided difference */
        sunrealtype delta_t = ONE / (t[j - i] - t[j]);
        N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
      }
    }

    /* Compute derivatives of Newton polynomial of f history */
    N_VScale(ONE, wrk[order - 1], zn[1]);
    for (int i = 2; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 2; i >= 0; i--)
    {
      for (int j = order - 1; j > 0; j--)
      {
        N_VLinearSum(t[0] - t[i], zn[j + 1], j, zn[j], zn[j + 1]);
      }
      N_VLinearSum(t[0] - t[i], zn[1], ONE, wrk[i], zn[1]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y, zn[0]);
  N_VScale(ONE, f[0], zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}